

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::tabChanged(QMainWindowLayout *this)

{
  QTabBar *pQVar1;
  QDockAreaLayoutInfo *pQVar2;
  QLayout *this_00;
  QDockWidgetGroupWindow *pQVar3;
  QWidget *this_01;
  int __sig;
  QDockWidget *in_RDI;
  QWidget *unaff_retaddr;
  QWidget *w;
  QDockWidgetGroupWindow *dwgw;
  QDockWidget *activated;
  QDockAreaLayoutInfo *info;
  QTabBar *tb;
  bool in_stack_0000004f;
  QDockAreaLayoutInfo *in_stack_00000050;
  
  QObject::sender();
  pQVar1 = qobject_cast<QTabBar*>((QObject *)0x5f8583);
  if ((pQVar1 != (QTabBar *)0x0) &&
     (pQVar2 = dockInfo((QMainWindowLayout *)w,unaff_retaddr), pQVar2 != (QDockAreaLayoutInfo *)0x0)
     ) {
    __sig = 0;
    this_00 = (QLayout *)QDockAreaLayoutInfo::apply(in_stack_00000050,in_stack_0000004f);
    if (this_00 != (QLayout *)0x0) {
      QLayout::parentWidget(this_00);
      __sig = (int)this_00;
      QMainWindow::tabifiedDockWidgetActivated((QMainWindow *)0x5f85e1,in_RDI);
    }
    QWidget::parentWidget((QWidget *)0x5f85eb);
    pQVar3 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5f85f3);
    if (pQVar3 != (QDockWidgetGroupWindow *)0x0) {
      QDockWidgetGroupWindow::adjustFlags(dwgw);
    }
    this_01 = centralWidget((QMainWindowLayout *)0x5f8613);
    if (this_01 != (QWidget *)0x0) {
      QWidget::raise(this_01,__sig);
    }
  }
  return;
}

Assistant:

void QMainWindowLayout::tabChanged()
{
    QTabBar *tb = qobject_cast<QTabBar*>(sender());
    if (tb == nullptr)
        return;
    QDockAreaLayoutInfo *info = dockInfo(tb);
    if (info == nullptr)
        return;

    QDockWidget *activated = info->apply(false);

    if (activated)
        emit static_cast<QMainWindow *>(parentWidget())->tabifiedDockWidgetActivated(activated);

    if (auto dwgw = qobject_cast<QDockWidgetGroupWindow*>(tb->parentWidget()))
        dwgw->adjustFlags();

    if (QWidget *w = centralWidget())
        w->raise();
}